

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
ezy::
join<std::__cxx11::string,ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,int[8]>>>,ezy::to_string_fn_const&>,std::basic_string_view<char,std::char_traits<char>>&>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,ezy *this,
          range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_int[8]>_>_>,_const_ezy::to_string_fn_&>
          *range,basic_string_view<char,_std::char_traits<char>_> *separator)

{
  reference paiVar1;
  to_string_fn *ptVar2;
  iterator_adaptor<ezy::detail::take_iterator<const_int[8]>,_const_ezy::to_string_fn_&> __first;
  iterator_adaptor<ezy::detail::take_iterator<const_int[8]>,_const_ezy::to_string_fn_&> __last;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result;
  anon_class_24_2_e8cc7173 in_stack_ffffffffffffff88;
  anon_class_24_2_e8cc7173 local_60;
  long local_48;
  undefined8 local_40;
  undefined8 local_38;
  iterator_adaptor<ezy::detail::take_iterator<const_int[8]>,_const_ezy::to_string_fn_&> local_30;
  
  local_60.separator._M_len = *(size_t *)(this + 8);
  if (local_60.separator._M_len == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_60.result = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this;
    local_60.separator._M_str = *(char **)(this + 0x10);
    detail::iterator_adaptor<ezy::detail::take_iterator<int_const[8]>,ezy::to_string_fn_const&>::
    operator*[abi_cxx11_(__return_storage_ptr__,&local_60);
    local_30.super_basic_iterator_adaptor<ezy::detail::take_iterator<const_int[8]>_>.orig.tracker.
    iters.super__Tuple_impl<0UL,_const_int_*>.super__Head_base<0UL,_const_int_*,_false>._M_head_impl
         = *(tuple<const_int_*> *)this;
    local_30.super_basic_iterator_adaptor<ezy::detail::take_iterator<const_int[8]>_>.orig.n =
         *(size_type *)(this + 8);
    local_30.converter = *(to_string_fn **)(this + 0x10);
    std::
    next<ezy::detail::iterator_adaptor<ezy::detail::take_iterator<int_const[8]>,ezy::to_string_fn_const&>>
              ((iterator_adaptor<ezy::detail::take_iterator<const_int[8]>,_const_ezy::to_string_fn_&>
                *)&stack0xffffffffffffff88,&local_30,1);
    local_38 = *(undefined8 *)(this + 0x10);
    local_48 = *(long *)this + 0x20;
    local_40 = 0;
    paiVar1 = (range->orig_range).t.range.t;
    ptVar2 = (to_string_fn *)(range->orig_range).t.n;
    __first.super_basic_iterator_adaptor<ezy::detail::take_iterator<const_int[8]>_>.orig.n =
         (size_type)paiVar1;
    __first.super_basic_iterator_adaptor<ezy::detail::take_iterator<const_int[8]>_>.orig.tracker.
    iters.super__Tuple_impl<0UL,_const_int_*>.super__Head_base<0UL,_const_int_*,_false>._M_head_impl
         = (tuple<const_int_*>)(tuple<const_int_*>)__return_storage_ptr__;
    __first.converter = ptVar2;
    __last.super_basic_iterator_adaptor<ezy::detail::take_iterator<const_int[8]>_>.orig.n =
         (size_type)paiVar1;
    __last.super_basic_iterator_adaptor<ezy::detail::take_iterator<const_int[8]>_>.orig.tracker.
    iters.super__Tuple_impl<0UL,_const_int_*>.super__Head_base<0UL,_const_int_*,_false>._M_head_impl
         = (tuple<const_int_*>)(tuple<const_int_*>)__return_storage_ptr__;
    __last.converter = ptVar2;
    std::
    for_each<ezy::detail::iterator_adaptor<ezy::detail::take_iterator<int_const[8]>,ezy::to_string_fn_const&>,ezy::join<std::__cxx11::string,ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,int[8]>>>,ezy::to_string_fn_const&>,std::basic_string_view<char,std::char_traits<char>>&>(ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,int[8]>>>,ezy::to_string_fn_const&>&&,std::basic_string_view<char,std::char_traits<char>>&)::_lambda(auto:1_const&)_1_>
              (&local_60,__first,__last,in_stack_ffffffffffffff88);
  }
  return __return_storage_ptr__;
}

Assistant:

constexpr ReturnType join(Range&& range, Separator&& separator = Separator{})
  {
    using std::begin;
    using std::end;
    if (ezy::empty(range))
    {
      return ReturnType{};
    }
    else
    {
      ReturnType result{*begin(range)};
      std::for_each(
          std::next(begin(range)),
          end(range),
          [&result,separator](const auto& e)
          {
            result += separator;
            result += e;
          }
        );
      return result;
    }
  }